

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

QRect QMdi::MinOverlapPlacer::findMinOverlapRect(QList<QRect> *source,QList<QRect> *rects)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  QRect *srcRect;
  QRect *source_00;
  long lVar4;
  int iVar5;
  QRect QVar6;
  undefined8 local_38;
  
  lVar4 = (source->d).size;
  uVar2 = 0;
  if (lVar4 == 0) {
    local_38 = 0xffffffffffffffff;
  }
  else {
    source_00 = (source->d).ptr;
    lVar4 = lVar4 << 4;
    local_38 = 0xffffffffffffffff;
    iVar5 = -1;
    uVar3 = 0;
    do {
      iVar1 = accumulatedOverlap(source_00,rects);
      if (iVar5 == -1 || iVar1 < iVar5) {
        uVar2._0_4_ = source_00->x1;
        uVar2._4_4_ = source_00->y1;
        local_38._0_4_ = source_00->x2;
        local_38._4_4_ = source_00->y2;
        uVar3 = uVar2 >> 0x20;
        iVar5 = iVar1;
      }
      source_00 = source_00 + 1;
      lVar4 = lVar4 + -0x10;
    } while (lVar4 != 0);
    uVar2 = uVar2 & 0xffffffff | uVar3 << 0x20;
  }
  QVar6.x2.m_i = (int)local_38;
  QVar6.y2.m_i = (int)((ulong)local_38 >> 0x20);
  QVar6.x1.m_i = (int)uVar2;
  QVar6.y1.m_i = (int)(uVar2 >> 0x20);
  return QVar6;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }